

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O0

RIFF_Chunk * Timidity::LoadRIFF(FILE *src)

{
  bool bVar1;
  int iVar2;
  BYTE *pBVar3;
  size_t sVar4;
  DWORD local_2c;
  DWORD *pDStack_28;
  DWORD subchunkDataLen;
  BYTE *subchunkData;
  RIFF_Chunk *chunk;
  FILE *src_local;
  
  src_local = (FILE *)operator_new(0x28);
  RIFF_Chunk::RIFF_Chunk((RIFF_Chunk *)src_local);
  fread(src_local,4,1,(FILE *)src);
  fread(&src_local->field_0x4,4,1,(FILE *)src);
  *(DWORD *)&src_local->field_0x4 = *(DWORD *)&src_local->field_0x4;
  if (src_local->_flags == 0x46464952) {
    pBVar3 = (BYTE *)malloc((ulong)*(uint *)&src_local->field_0x4);
    src_local->_IO_read_end = (char *)pBVar3;
    if ((BYTE *)src_local->_IO_read_end == (BYTE *)0x0) {
      if (src_local != (FILE *)0x0) {
        RIFF_Chunk::~RIFF_Chunk((RIFF_Chunk *)src_local);
        operator_delete(src_local,0x28);
      }
      src_local = (FILE *)0x0;
    }
    else {
      sVar4 = fread(src_local->_IO_read_end,(ulong)*(uint *)&src_local->field_0x4,1,(FILE *)src);
      if (sVar4 == 1) {
        pDStack_28 = (DWORD *)src_local->_IO_read_end;
        local_2c = *(DWORD *)&src_local->field_0x4;
        bVar1 = ChunkHasSubType(src_local->_flags);
        if ((bVar1) && (3 < local_2c)) {
          *(DWORD *)&src_local->_IO_read_ptr = *pDStack_28;
          pDStack_28 = pDStack_28 + 1;
          local_2c = local_2c - 4;
        }
        iVar2 = ChunkHasSubChunks(src_local->_flags);
        if (iVar2 != 0) {
          LoadSubChunks((RIFF_Chunk *)src_local,(BYTE *)pDStack_28,local_2c);
        }
      }
      else {
        FreeRIFF((RIFF_Chunk *)src_local);
        src_local = (FILE *)0x0;
      }
    }
  }
  else {
    if (src_local != (FILE *)0x0) {
      RIFF_Chunk::~RIFF_Chunk((RIFF_Chunk *)src_local);
      operator_delete(src_local,0x28);
    }
    src_local = (FILE *)0x0;
  }
  return (RIFF_Chunk *)src_local;
}

Assistant:

RIFF_Chunk *LoadRIFF(FILE *src)
{
	RIFF_Chunk *chunk;
	BYTE *subchunkData;
	DWORD subchunkDataLen;

	/* Allocate the chunk structure */
	chunk = new RIFF_Chunk;

	/* Make sure the file is in RIFF format */
	fread(&chunk->magic, 4, 1, src);
	fread(&chunk->length, 4, 1, src);
	chunk->length = LittleLong(chunk->length);
	if ( chunk->magic != RIFF ) {
		__Sound_SetError("Not a RIFF file");
		delete chunk;
		return NULL;
	}
	chunk->data = (BYTE *)malloc(chunk->length);
	if ( chunk->data == NULL ) {
		__Sound_SetError(ERR_OUT_OF_MEMORY);
		delete chunk;
		return NULL;
	}
	if ( fread(chunk->data, chunk->length, 1, src) != 1 ) {
		__Sound_SetError(ERR_IO_ERROR);
		FreeRIFF(chunk);
		return NULL;
	}
	subchunkData = chunk->data;
	subchunkDataLen = chunk->length;
	if ( ChunkHasSubType(chunk->magic) && subchunkDataLen >= 4 ) {
		chunk->subtype = *(DWORD *)subchunkData;
		subchunkData += 4;
		subchunkDataLen -= 4;
	}
	if ( ChunkHasSubChunks(chunk->magic) ) {
		LoadSubChunks(chunk, subchunkData, subchunkDataLen);
	}
	return chunk;
}